

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_image_load_bricks(nifti_image *nim,int nbricks,int *blist,nifti_brick_list *NBL)

{
  size_t *psVar1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  bool bVar5;
  znzFile fp_00;
  ulong uVar6;
  int iVar7;
  void *__dest;
  void **ppvVar8;
  void *pvVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  long lVar20;
  long offset;
  size_t sStack_70;
  void *local_60;
  znzFile fp;
  long local_38;
  
  if ((nim == (nifti_image *)0x0) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",nim,NBL);
    return -1;
  }
  if (nbricks < 1 && blist != (int *)0x0) {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-d load_bricks: received blist with nbricks = %d,ignoring blist\n",
              (ulong)(uint)nbricks);
    }
  }
  else if (blist != (int *)0x0) {
    iVar7 = valid_nifti_brick_list(nim,nbricks,blist,(uint)(0 < g_opts_0));
    if (iVar7 == 0) {
      return -1;
    }
    sVar19 = (long)nbricks << 2;
    __dest = malloc(sVar19);
    local_60 = malloc(sVar19);
    if ((__dest == (void *)0x0) || (local_60 == (void *)0x0)) {
      fprintf(_stderr,"** NCS: failed to alloc %d ints for sorting\n",(ulong)(uint)nbricks);
    }
    else {
      memcpy(__dest,blist,sVar19);
      uVar14 = 0;
      uVar16 = 0;
      if (0 < nbricks) {
        uVar16 = (ulong)(uint)nbricks;
      }
      for (; uVar16 != uVar14; uVar14 = uVar14 + 1) {
        *(int *)((long)local_60 + uVar14 * 4) = (int)uVar14;
      }
      iVar7 = 1;
      if (1 < nbricks) {
        iVar7 = nbricks;
      }
      uVar14 = 1;
      for (uVar12 = 0; uVar12 != iVar7 - 1; uVar12 = uVar12 + 1) {
        uVar17 = uVar12 & 0xffffffff;
        for (uVar13 = uVar14; lVar10 = (long)(int)uVar17, (int)uVar13 < nbricks; uVar13 = uVar13 + 1
            ) {
          uVar6 = uVar13 & 0xffffffff;
          if (*(int *)((long)__dest + lVar10 * 4) <= *(int *)((long)__dest + uVar13 * 4)) {
            uVar6 = uVar17;
          }
          uVar17 = uVar6;
        }
        if (uVar12 != uVar17) {
          uVar3 = *(undefined4 *)((long)__dest + uVar12 * 4);
          *(undefined4 *)((long)__dest + uVar12 * 4) = *(undefined4 *)((long)__dest + lVar10 * 4);
          *(undefined4 *)((long)__dest + lVar10 * 4) = uVar3;
          uVar3 = *(undefined4 *)((long)local_60 + uVar12 * 4);
          *(undefined4 *)((long)local_60 + uVar12 * 4) =
               *(undefined4 *)((long)local_60 + lVar10 * 4);
          *(undefined4 *)((long)local_60 + lVar10 * 4) = uVar3;
        }
        uVar14 = uVar14 + 1;
      }
      if (2 < g_opts_0) {
        fwrite("+d sorted indexing list:\n",0x19,1,_stderr);
        fwrite("  orig   : ",0xb,1,_stderr);
        for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
          fprintf(_stderr,"  %d",(ulong)(uint)blist[uVar14]);
        }
        fwrite("\n  new    : ",0xc,1,_stderr);
        for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
          fprintf(_stderr,"  %d",(ulong)*(uint *)((long)__dest + uVar14 * 4));
        }
        fwrite("\n  indices: ",0xc,1,_stderr);
        for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
          fprintf(_stderr,"  %d",(ulong)*(uint *)((long)local_60 + uVar14 * 4));
        }
        fputc(10,_stderr);
      }
      uVar14 = 0;
      do {
        if (iVar7 - 1 == uVar14) {
          if (2 < g_opts_0) {
            fwrite("-d sorting is okay\n",0x13,1,_stderr);
          }
          bVar5 = false;
          goto LAB_0010c62a;
        }
        iVar4 = *(int *)((long)__dest + uVar14 * 4);
      } while ((iVar4 <= *(int *)((long)__dest + uVar14 * 4 + 4)) &&
              (lVar10 = uVar14 * 4, uVar14 = uVar14 + 1,
              blist[*(int *)((long)local_60 + lVar10)] == iVar4));
      fwrite("** sorting screw-up, way to go, rick!\n",0x26,1,_stderr);
    }
    goto LAB_0010c66e;
  }
  __dest = (void *)0x0;
  bVar5 = true;
  local_60 = (void *)0x0;
LAB_0010c62a:
  fp = nifti_image_load_prep(nim);
  if (fp == (znzFile)0x0) {
    if (0 < g_opts_0) {
      fwrite("** nifti_image_load_bricks, failed load_prep\n",0x2d,1,_stderr);
    }
    if (bVar5) {
      return -1;
    }
LAB_0010c66e:
    free(__dest);
    free(local_60);
    return -1;
  }
  uVar15 = 0;
  if (!bVar5) {
    uVar15 = nbricks;
  }
  if ((int)uVar15 < 1) {
    NBL->nbricks = 1;
    iVar7 = nim->ndim;
    nbricks = 1;
    for (lVar10 = 0xc; lVar10 + -8 <= (long)iVar7; lVar10 = lVar10 + 1) {
      nbricks = nbricks * nim->dim[lVar10 + -8];
      NBL->nbricks = nbricks;
    }
  }
  else {
    NBL->nbricks = uVar15;
  }
  sVar19 = (long)nim->nbyper * (long)nim->nz * (long)nim->ny * (long)nim->nx;
  NBL->bsize = sVar19;
  ppvVar8 = (void **)malloc((long)nbricks << 3);
  NBL->bricks = ppvVar8;
  if (ppvVar8 == (void **)0x0) {
    fprintf(_stderr,"** NANM: failed to alloc %d void ptrs\n",(ulong)uVar15);
LAB_0010ca18:
    if (!bVar5) {
      free(__dest);
      free(local_60);
    }
    Xznzclose(&fp);
    return -1;
  }
  psVar1 = &NBL->bsize;
  uVar16 = 0;
  uVar14 = 0;
  if (0 < nbricks) {
    uVar14 = (ulong)(uint)nbricks;
  }
  for (; uVar14 != uVar16; uVar16 = uVar16 + 1) {
    pvVar9 = malloc(sVar19);
    ppvVar8[uVar16] = pvVar9;
    ppvVar8 = NBL->bricks;
    if (ppvVar8[uVar16] == (void *)0x0) {
      fprintf(_stderr,"** NANM: failed to alloc %u bytes for brick %d\n",sVar19 & 0xffffffff,
              uVar16 & 0xffffffff);
      for (; 0 < (long)uVar16; uVar16 = uVar16 - 1) {
        free(NBL->bricks[uVar16 - 1]);
      }
      free(NBL->bricks);
      NBL->nbricks = 0;
      *psVar1 = 0;
      NBL->bricks = (void **)0x0;
      goto LAB_0010ca18;
    }
  }
  if (2 < g_opts_0) {
    fprintf(_stderr,"+d NANM: alloc\'d %d bricks of %u bytes for NBL\n",(ulong)(uint)nbricks,
            sVar19 & 0xffffffff);
  }
  fp_00 = fp;
  lVar10 = znztell(fp);
  local_38 = lVar10;
  if (lVar10 < 0) {
    pcVar18 = "** load bricks: ztell failed??\n";
    sStack_70 = 0x1f;
LAB_0010cab0:
    fwrite(pcVar18,sStack_70,1,_stderr);
LAB_0010cab9:
    nifti_free_NBL(NBL);
    NBL->nbricks = 0;
LAB_0010cac5:
    if (__dest == (void *)0x0) goto LAB_0010cadc;
  }
  else {
    if (__dest == (void *)0x0) {
      for (uVar14 = 0; (long)uVar14 < (long)NBL->nbricks; uVar14 = uVar14 + 1) {
        sVar11 = nifti_read_buffer(fp_00,NBL->bricks[uVar14],NBL->bsize,nim);
        if (sVar11 != NBL->bsize) {
          pcVar18 = nim->iname;
          if (pcVar18 == (char *)0x0) {
            pcVar18 = nim->fname;
          }
          fprintf(_stderr,"** load bricks: cannot read brick %d from \'%s\'\n",uVar14 & 0xffffffff,
                  pcVar18);
          goto LAB_0010cab9;
        }
      }
      if (1 < g_opts_0) {
        pcVar18 = nim->iname;
        if (pcVar18 == (char *)0x0) {
          pcVar18 = nim->fname;
        }
        fprintf(_stderr,"+d read %d default %u-byte bricks from file %s\n",(long)NBL->nbricks,
                (ulong)(uint)*psVar1,pcVar18);
      }
      goto LAB_0010cac5;
    }
    if (local_60 == (void *)0x0) {
      pcVar18 = "** load_NBL_bricks: missing index list\n";
      sStack_70 = 0x27;
      goto LAB_0010cab0;
    }
    uVar15 = 0xffffffff;
    for (lVar20 = 0; lVar20 < NBL->nbricks; lVar20 = lVar20 + 1) {
      uVar2 = *(uint *)((long)__dest + lVar20 * 4);
      iVar7 = *(int *)((long)local_60 + lVar20 * 4);
      if (uVar2 == uVar15) {
        memcpy(NBL->bricks[iVar7],NBL->bricks[*(int *)((long)local_60 + lVar20 * 4 + -4)],NBL->bsize
              );
      }
      else {
        sVar11 = *psVar1;
        offset = (long)(int)uVar2 * sVar11 + local_38;
        if (lVar10 != offset) {
          lVar10 = znzseek(fp_00,offset,0);
          if (lVar10 < 0) {
            pcVar18 = nim->iname;
            if (pcVar18 == (char *)0x0) {
              pcVar18 = nim->fname;
            }
            fprintf(_stderr,"** failed to locate brick %d in file \'%s\'\n",(ulong)uVar2,pcVar18);
            goto LAB_0010cab9;
          }
          sVar11 = *psVar1;
          lVar10 = offset;
        }
        sVar11 = nifti_read_buffer(fp_00,NBL->bricks[iVar7],sVar11,nim);
        if (sVar11 != NBL->bsize) {
          pcVar18 = nim->iname;
          if (pcVar18 == (char *)0x0) {
            pcVar18 = nim->fname;
          }
          fprintf(_stderr,"** failed to read brick %d from file \'%s\'\n",(ulong)uVar2,pcVar18);
          if (1 < g_opts_0) {
            fprintf(_stderr,"   (read %u of %u bytes)\n",sVar11 & 0xffffffff,(ulong)(uint)*psVar1);
          }
          goto LAB_0010cab9;
        }
        lVar10 = lVar10 + sVar11;
      }
      uVar15 = uVar2;
    }
  }
  free(__dest);
  free(local_60);
LAB_0010cadc:
  Xznzclose(&fp);
  return NBL->nbricks;
}

Assistant:

int nifti_image_load_bricks( nifti_image * nim , int nbricks,
                             const int * blist, nifti_brick_list * NBL )
{
   int     * slist = NULL, * sindex = NULL, rv;
   znzFile   fp;

   /* we can have blist == NULL */
   if( !nim || !NBL ){
      fprintf(stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",
              (void *)nim, (void *)NBL);
      return -1;
   }

   if( blist && nbricks <= 0 ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d load_bricks: received blist with nbricks = %d,"
                        "ignoring blist\n", nbricks);
      blist = NULL; /* pretend nothing was passed */
   }

   if( blist && ! valid_nifti_brick_list(nim, nbricks, blist, g_opts.debug>0) )
      return -1;

   /* for efficiency, let's read the file in order */
   if( blist && nifti_copynsort( nbricks, blist, &slist, &sindex ) != 0 )
      return -1;

   /* open the file and position the FILE pointer */
   fp = nifti_image_load_prep( nim );
   if( !fp ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_image_load_bricks, failed load_prep\n");
      if( blist ){ free(slist); free(sindex); }
      return -1;
   }

   /* this will flag to allocate defaults */
   if( !blist ) nbricks = 0;
   if( nifti_alloc_NBL_mem( nim, nbricks, NBL ) != 0 ){
      if( blist ){ free(slist); free(sindex); }
      znzclose(fp);
      return -1;
   }

   rv = nifti_load_NBL_bricks(nim, slist, sindex, NBL, fp);

   if( rv != 0 ){
      nifti_free_NBL( NBL );  /* failure! */
      NBL->nbricks = 0; /* repetative, but clear */
   }

   if( slist ){ free(slist); free(sindex); }

   znzclose(fp);

   return NBL->nbricks;
}